

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void checkobject(global_State *g,GCObject *o,int maybedead,int listage)

{
  int listage_local;
  int maybedead_local;
  GCObject *o_local;
  global_State *g_local;
  
  if ((o->marked & (g->currentwhite ^ 0x18)) == 0) {
    if ((g->gcstate == '\b') && ((o->marked & 0x18) == 0)) {
      __assert_fail("g->gcstate != 8 || (((o)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x19e,"void checkobject(global_State *, GCObject *, int, int)");
    }
    if (g->gckind == '\x01') {
      if ((int)(o->marked & 7) < listage) {
        __assert_fail("((o)->marked & 7) >= listage",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a0,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (((o->marked & 0x18) != 0) && (1 < (o->marked & 7))) {
        __assert_fail("!(((o)->marked) & (((1<<(3)) | (1<<(4))))) || !(((o)->marked & 7) > 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a1,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if ((((1 < (o->marked & 7)) && ((o->marked & 0x20) == 0)) && ((o->marked & 7) != 5)) &&
         (((o->marked & 7) != 2 && (o->tt != '\b')))) {
        __assert_fail("(((o)->marked) & ((1<<(5)))) || ((o)->marked & 7) == 5 || ((o)->marked & 7) == 2 || o->tt == 8"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a7,"void checkobject(global_State *, GCObject *, int, int)");
      }
    }
    checkrefs(g,o);
  }
  else if (maybedead == 0) {
    __assert_fail("maybedead",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x19c,"void checkobject(global_State *, GCObject *, int, int)");
  }
  return;
}

Assistant:

static void checkobject (global_State *g, GCObject *o, int maybedead,
                         int listage) {
  if (isdead(g, o))
    lua_assert(maybedead);
  else {
    lua_assert(g->gcstate != GCSpause || iswhite(o));
    if (g->gckind == KGC_GEN) {  /* generational mode? */
      lua_assert(getage(o) >= listage);
      lua_assert(!iswhite(o) || !isold(o));
      if (isold(o)) {
        lua_assert(isblack(o) ||
        getage(o) == G_TOUCHED1 ||
        getage(o) == G_OLD0 ||
        o->tt == LUA_TTHREAD /* ||
        (o->tt == LUA_TUPVAL && upisopen(gco2upv(o)))*/);
      }
    }
    checkrefs(g, o);
  }
}